

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O2

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::MTexPoly>
          (Structure *this,MTexPoly *dest,FileDatabase *db)

{
  shared_ptr<Assimp::Blender::Image> tpage;
  shared_ptr<Assimp::Blender::Image> local_28;
  
  local_28.super___shared_ptr<Assimp::Blender::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (Image *)0x0;
  local_28.super___shared_ptr<Assimp::Blender::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Image>(this,&local_28,"*tpage",db,false);
  dest->tpage = local_28.super___shared_ptr<Assimp::Blender::Image,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<Assimp::Blender::Image,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ReadField<1,char>(this,&dest->flag,"flag",db);
  ReadField<1,char>(this,&dest->transp,"transp",db);
  ReadField<1,short>(this,&dest->mode,"mode",db);
  ReadField<1,short>(this,&dest->tile,"tile",db);
  ReadField<1,short>(this,&dest->pad,"pad",db);
  StreamReader<true,_true>::IncPtr
            ((db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,this->size);
  return;
}

Assistant:

void Structure :: Convert<MTexPoly> (
    MTexPoly& dest,
    const FileDatabase& db
    ) const
{

    {
        std::shared_ptr<Image> tpage;
        ReadFieldPtr<ErrorPolicy_Igno>(tpage,"*tpage",db);
        dest.tpage = tpage.get();
    }
    ReadField<ErrorPolicy_Igno>(dest.flag,"flag",db);
    ReadField<ErrorPolicy_Igno>(dest.transp,"transp",db);
    ReadField<ErrorPolicy_Igno>(dest.mode,"mode",db);
    ReadField<ErrorPolicy_Igno>(dest.tile,"tile",db);
    ReadField<ErrorPolicy_Igno>(dest.pad,"pad",db);

    db.reader->IncPtr(size);
}